

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O3

uint8_t * __thiscall
FastPForLib::VariableByte::decodeFromByteArray<unsigned_int>
          (VariableByte *this,uint8_t *inbyte,size_t length,uint *out,size_t *nvalue)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint *puVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  if (length == 0) {
    sVar6 = 0;
  }
  else {
    pbVar1 = inbyte + length;
    puVar5 = out;
    if (10 < (long)length) {
      pbVar4 = inbyte;
      pbVar3 = inbyte + 10;
      do {
        inbyte = pbVar3;
        bVar2 = *pbVar4;
        if ((char)bVar2 < '\0') {
          uVar8 = bVar2 & 0x7f;
          inbyte = pbVar4 + 1;
        }
        else {
          uVar8 = (pbVar4[1] & 0x7f) << 7 | (uint)bVar2;
          if ((char)pbVar4[1] < '\0') {
            inbyte = pbVar4 + 2;
          }
          else {
            uVar8 = (pbVar4[2] & 0x7f) << 0xe | uVar8;
            if ((char)pbVar4[2] < '\0') {
              inbyte = pbVar4 + 3;
            }
            else {
              uVar8 = (pbVar4[3] & 0x7f) << 0x15 | uVar8;
              if ((char)pbVar4[3] < '\0') {
                inbyte = pbVar4 + 4;
              }
              else {
                uVar8 = (uint)pbVar4[4] << 0x1c | uVar8;
                if ((char)pbVar4[4] < '\0') {
                  inbyte = pbVar4 + 5;
                }
                else if ((char)pbVar4[5] < '\0') {
                  inbyte = pbVar4 + 6;
                }
                else if ((char)pbVar4[6] < '\0') {
                  inbyte = pbVar4 + 7;
                }
                else if ((char)pbVar4[7] < '\0') {
                  inbyte = pbVar4 + 8;
                }
                else if ((char)pbVar4[8] < '\0') {
                  inbyte = pbVar4 + 9;
                }
              }
            }
          }
        }
        *puVar5 = uVar8;
        puVar5 = puVar5 + 1;
        pbVar4 = inbyte;
        pbVar3 = inbyte + 10;
      } while (inbyte + 10 < pbVar1);
    }
    if (inbyte < pbVar1) {
      do {
        lVar9 = 0;
        uVar7 = 0;
        do {
          pbVar4 = inbyte;
          lVar9 = ((ulong)(*pbVar4 & 0x7f) << (uVar7 & 0x3f)) + lVar9;
          if ((char)*pbVar4 < '\0') {
            *puVar5 = (uint)lVar9;
            puVar5 = puVar5 + 1;
            break;
          }
          uVar7 = (ulong)((int)uVar7 + 7);
          inbyte = pbVar4 + 1;
        } while (pbVar4 + 1 < pbVar1);
        inbyte = pbVar4 + 1;
      } while (inbyte < pbVar1);
      inbyte = pbVar4 + 1;
    }
    sVar6 = (long)puVar5 - (long)out >> 2;
  }
  *nvalue = sVar6;
  return inbyte;
}

Assistant:

const uint8_t *decodeFromByteArray(const uint8_t *inbyte, const size_t length,
                                     T *out, size_t &nvalue) {
    if (length == 0) {
      nvalue = 0;
      return inbyte;  // abort
    }
    const uint8_t *const endbyte = inbyte + length;
    const T *const initout(out);
    // this assumes that there is a value to be read

    while (endbyte > inbyte + 10) {
      uint64_t c;
      T v = 0;

      c = inbyte[0];
      v = c & 0x7F;
      if (c >= 128) {
        inbyte += 1;
        *out++ = v;
        continue;
      }

      c = inbyte[1];
      v |= (c & 0x7F) << 7;
      if (c >= 128) {
        inbyte += 2;
        *out++ = v;
        continue;
      }

      c = inbyte[2];
      v |= (c & 0x7F) << 14;
      if (c >= 128) {
        inbyte += 3;
        *out++ = v;
        continue;
      }

      c = inbyte[3];
      v |= (c & 0x7F) << 21;
      if (c >= 128) {
        inbyte += 4;
        *out++ = v;
        continue;
      }

      c = inbyte[4];
      v |= (c & 0x7F) << 28;
      if (c >= 128) {
        inbyte += 5;
        *out++ = v;
        continue;
      }

      c = inbyte[5];
      v |= static_cast<uint64_t>(c & 0x7F) << 35;
      if (c >= 128) {
        inbyte += 6;
        *out++ = v;
        continue;
      }

      c = inbyte[6];
      v |= static_cast<uint64_t>(c & 0x7F) << 42;
      if (c >= 128) {
        inbyte += 7;
        *out++ = v;
        continue;
      }

      c = inbyte[7];
      v |= static_cast<uint64_t>(c & 0x7F) << 49;
      if (c >= 128) {
        inbyte += 8;
        *out++ = v;
        continue;
      }

      c = inbyte[8];
      v |= static_cast<uint64_t>(c & 0x7F) << 56;
      if (c >= 128) {
        inbyte += 9;
        *out++ = v;
        continue;
      }

      c = inbyte[9];
      inbyte += 10;
      v |= static_cast<uint64_t>(c & 0x1) << 63;
      *out++ = v;
    }

    while (endbyte > inbyte) {
      unsigned int shift = 0;
      for (T v = 0; endbyte > inbyte; shift += 7) {
        uint64_t c = *inbyte++;
        v += ((c & 127) << shift);
        if ((c & 128)) {
          *out++ = v;
          break;
        }
      }
    }
    nvalue = out - initout;
    return inbyte;
  }